

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.cpp
# Opt level: O3

void __thiscall
SQCompilation::ClosureHoistingOpt::HoistingVisitor::visitBlock(HoistingVisitor *this,Block *b)

{
  RelocateState state;
  RelocateState local_40;
  
  local_40.statements = &b->_statements;
  local_40.prev = this->relocState;
  local_40.index = 0;
  local_40.size = (size_t)(b->_statements)._size;
  local_40.depth = this->scopeDepth;
  this->relocState = &local_40;
  local_40.visitor = this;
  if (local_40.size != 0) {
    do {
      Node::visit<SQCompilation::ClosureHoistingOpt::HoistingVisitor>
                (&(b->_statements)._vals[local_40.index & 0xffffffff]->super_Node,this);
      local_40.index = local_40.index + 1;
    } while (local_40.index < local_40.size);
  }
  (local_40.visitor)->relocState = local_40.prev;
  return;
}

Assistant:

void ClosureHoistingOpt::HoistingVisitor::visitBlock(Block *b) {
  auto &statements = b->statements();

  RelocateState state(statements, this);

  for (; state.index < state.size; ++state.index) {
    Statement *stmt = statements[state.index];
    stmt->visit(this);
  }
}